

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.hh
# Opt level: O3

void Arguments::postprocess(void)

{
  float fVar1;
  long lVar2;
  ulong uVar3;
  float fVar4;
  ulong local_9c8 [312];
  undefined8 local_8;
  
  fVar1 = pacman_speed;
  fVar4 = ghost_speed * pacman_speed;
  initial_chase_cycle_rounds = (int)((float)initial_chase_cycle_rounds / pacman_speed);
  initial_scatter_cycle_rounds = (int)((float)initial_scatter_cycle_rounds / pacman_speed);
  cycle_rounds_stdev = cycle_rounds_stdev / pacman_speed;
  n_rounds_ghost_revive = (int)((float)n_rounds_ghost_revive / pacman_speed);
  n_rounds_powerpill = (int)((float)n_rounds_powerpill / pacman_speed);
  n_rounds_between_ghosts_start = (int)((float)n_rounds_between_ghosts_start / pacman_speed);
  local_9c8[0] = (ulong)random_seed;
  lVar2 = 1;
  uVar3 = local_9c8[0];
  do {
    uVar3 = (uVar3 >> 0x3e ^ uVar3) * 0x5851f42d4c957f2d + lVar2;
    local_9c8[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x138);
  local_8 = 0x138;
  ghost_speed = fVar4;
  memcpy(&random_generator,local_9c8,0x9c8);
  reward_step = (double)fVar1 * reward_step;
  visualization_speed = (double)(fVar4 * 180000.0) / visualization_speed;
  if (pacman_ai_agent == INPUT) {
    plays = 1;
  }
  test_sampling_interval = test_statistics_precision / test_sampling;
  return;
}

Assistant:

void Arguments::postprocess() {
    Arguments::ghost_speed *= Arguments::pacman_speed;

    Arguments::initial_chase_cycle_rounds /= Arguments::pacman_speed;
    Arguments::initial_scatter_cycle_rounds /= Arguments::pacman_speed;
    Arguments::cycle_rounds_stdev /= Arguments::pacman_speed;
    Arguments::n_rounds_ghost_revive /= Arguments::pacman_speed;
    Arguments::n_rounds_powerpill /= Arguments::pacman_speed;
    Arguments::n_rounds_between_ghosts_start /= Arguments::pacman_speed;

    Arguments::random_generator = mt19937_64(Arguments::random_seed);

    Arguments::reward_step *= Arguments::pacman_speed;

    Arguments::visualization_speed = 180000*Arguments::ghost_speed/Arguments::visualization_speed;

    if (Arguments::pacman_ai_agent == INPUT) Arguments::plays = 1;

    Arguments::test_sampling_interval = Arguments::test_statistics_precision/Arguments::test_sampling;
}